

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O2

int __thiscall Arcflow::init(Arcflow *this,EVP_PKEY_CTX *ctx)

{
  NodeSet *this_00;
  Instance *this_01;
  vector<Item,_std::allocator<Item>_> *pvVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_02;
  pointer piVar3;
  pointer pAVar4;
  pointer pAVar5;
  int d;
  int iVar6;
  int extraout_EAX;
  long lVar7;
  clock_t cVar8;
  ulong uVar9;
  runtime_error *prVar10;
  ulong uVar11;
  pointer pvVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  int i_1;
  uint uVar16;
  int i;
  uint uVar17;
  long lVar18;
  allocator_type local_171;
  int *local_170;
  vector<int,_std::allocator<int>_> *local_168;
  Instance *local_160;
  vector<int,_std::allocator<int>_> max_state;
  value_type local_13c;
  char _error_msg_ [256];
  
  if (this->ready != false) {
    snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x1f);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,_error_msg_);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = &this->inst;
  Instance::operator=(this_01,(Instance *)ctx);
  local_170 = &(this->inst).nsizes;
  iVar6 = (this->inst).ndims;
  this->LOSS = (this->inst).nsizes;
  this->label_size = iVar6;
  Instance::sorted_items((vector<Item,_std::allocator<Item>_> *)_error_msg_,this_01);
  pvVar1 = &this->sitems;
  std::vector<Item,_std::allocator<Item>_>::_M_move_assign
            (pvVar1,(vector<Item,_std::allocator<Item>_> *)_error_msg_);
  std::vector<Item,_std::allocator<Item>_>::~vector
            ((vector<Item,_std::allocator<Item>_> *)_error_msg_);
  pvVar2 = &this->maxW;
  _error_msg_[0] = '\0';
  _error_msg_[1] = '\0';
  _error_msg_[2] = '\0';
  _error_msg_[3] = '\0';
  std::vector<int,_std::allocator<int>_>::resize
            (pvVar2,(long)this->label_size,(value_type *)_error_msg_);
  for (lVar7 = 0; lVar7 < this_01->ndims; lVar7 = lVar7 + 1) {
    piVar3 = (this->maxW).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar12 = (this->inst).Ws.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (lVar14 = 0; lVar14 < (this->inst).nbtypes; lVar14 = lVar14 + 1) {
      iVar6 = piVar3[lVar7];
      iVar15 = *(int *)(*(long *)&(pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data + lVar7 * 4);
      if (iVar15 < iVar6) {
        iVar15 = iVar6;
      }
      piVar3[lVar7] = iVar15;
      pvVar12 = pvVar12 + 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::operator=(&this->max_label,pvVar2);
  if ((this->inst).binary != false) {
    this->label_size = (this->inst).ndims + 1;
    _error_msg_[0] = -1;
    _error_msg_[1] = -1;
    _error_msg_[2] = -1;
    _error_msg_[3] = '\x7f';
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->max_label,(int *)_error_msg_);
  }
  std::vector<int,_std::allocator<int>_>::vector(&max_state,pvVar2);
  std::vector<int,_std::allocator<int>_>::push_back(&max_state,local_170);
  if ((this->inst).binary == false) {
    _error_msg_[0] = '\0';
    _error_msg_[1] = '\0';
    _error_msg_[2] = '\0';
    _error_msg_[3] = '\0';
    uVar11 = 0;
    uVar9 = (ulong)(uint)*local_170;
    if (*local_170 < 1) {
      uVar9 = uVar11;
    }
    for (; uVar9 * 0x48 - uVar11 != 0; uVar11 = uVar11 + 0x48) {
      iVar6 = *(int *)((long)&((pvVar1->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
                               super__Vector_impl_data._M_start)->demand + uVar11);
      if ((int)_error_msg_._0_4_ <= iVar6) {
        _error_msg_._0_4_ = iVar6;
      }
    }
    std::vector<int,_std::allocator<int>_>::push_back(&max_state,(value_type *)_error_msg_);
  }
  this_02 = &this->weights;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(this_02,(long)(this->inst).nsizes);
  lVar14 = 0;
  lVar7 = 0;
  local_168 = pvVar2;
  local_160 = this_01;
  for (lVar18 = 0; lVar18 < *local_170; lVar18 = lVar18 + 1) {
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)
               ((long)&(((this_02->
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl + lVar14),
               (vector<int,_std::allocator<int>_> *)
               ((long)&(((pvVar1->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
                         super__Vector_impl_data._M_start)->w).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar7));
    lVar7 = lVar7 + 0x48;
    lVar14 = lVar14 + 0x18;
  }
  local_13c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)_error_msg_,(long)local_160->ndims,&local_13c,
             &local_171);
  std::
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  ::emplace_back<std::vector<int,std::allocator<int>>>
            ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
              *)this_02,(vector<int,_std::allocator<int>_> *)_error_msg_);
  pvVar2 = local_168;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)_error_msg_);
  count_max_rep((vector<int,_std::allocator<int>_> *)_error_msg_,this,pvVar2,0,0);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->max_rep,(_Vector_base<int,_std::allocator<int>_> *)_error_msg_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)_error_msg_);
  lVar7 = 0;
  while( true ) {
    if ((int)((ulong)((long)max_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)max_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) <= lVar7) break;
    _error_msg_[0] = '\0';
    _error_msg_[1] = '\0';
    _error_msg_[2] = '\0';
    _error_msg_[3] = '\0';
    iVar15 = 1;
    for (iVar6 = max_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7]; iVar6 != 0; iVar6 = iVar6 >> 1) {
      _error_msg_._0_4_ = iVar15;
      iVar15 = iVar15 + 1;
    }
    std::vector<int,_std::allocator<int>_>::push_back(&this->hash_bits,(value_type *)_error_msg_);
    lVar7 = lVar7 + 1;
  }
  printf("Build (method = %d)\n",(ulong)(uint)(this->inst).method);
  if ((this->inst).method == -3) {
    build(this);
    this_00 = &this->NS;
    iVar6 = NodeSet::size(this_00);
    uVar13 = iVar6 + (this->inst).nbtypes;
    pAVar4 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data
             ._M_start;
    pAVar5 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data
             ._M_finish;
    iVar6 = NodeSet::size(this_00);
    uVar16 = (int)(((long)pAVar5 - (long)pAVar4) / 0xc) + (iVar6 + -1) * (this->inst).nbtypes + 1;
    cVar8 = clock();
    printf("  Step-3\' Graph: %d vertices and %d arcs (%.2fs)\n",
           (double)(cVar8 - this->tstart) / 1000000.0,(ulong)uVar13,(ulong)uVar16);
    final_compression_step(this);
    finalize(this);
    iVar6 = NodeSet::size(this_00);
    uVar17 = iVar6 + (int)((ulong)((long)(this->Ts).super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->Ts).super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2);
    uVar9 = ((long)(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0xc;
    cVar8 = clock();
    printf("  Step-4\' Graph: %d vertices and %d arcs (%.2fs)\n",
           (double)(cVar8 - this->tstart) / 1000000.0,(ulong)uVar17,uVar9 & 0xffffffff);
    printf("  #V4/#V3 = %.2f\n",(double)(int)uVar17 / (double)(int)uVar13);
    printf("  #A4/#A3 = %.2f\n",(double)(int)uVar9 / (double)(int)uVar16);
    cVar8 = clock();
    printf("Ready! (%.2fs)\n",(double)(cVar8 - this->tstart) / 1000000.0);
    if (this->ready != false) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&max_state.super__Vector_base<int,_std::allocator<int>_>);
      return extraout_EAX;
    }
    snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == true",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x5e);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,_error_msg_);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
           "inst.method >= MIN_METHOD && inst.method <= MAX_METHOD",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
           ,0x4d);
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar10,_error_msg_);
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::init(const Instance &_inst) {
	throw_assert(ready == false);
	inst = _inst;
	LOSS = inst.nsizes;
	label_size = inst.ndims;
	sitems = inst.sorted_items();
	maxW.resize(label_size, 0);
	for (int d = 0; d < inst.ndims; d++) {
		for (int t = 0; t < inst.nbtypes; t++) {
			maxW[d] = std::max(maxW[d], inst.Ws[t][d]);
		}
	}

	max_label = maxW;
	if (inst.binary) {
		label_size = inst.ndims + 1;
		max_label.push_back(INT_MAX);
	}

	std::vector<int> max_state = maxW;
	max_state.push_back(inst.nsizes);
	if (!inst.binary) {
		int maxb = 0;
		for (int it = 0; it < inst.nsizes; it++) {
			maxb = std::max(maxb, sitems[it].demand);
		}
		max_state.push_back(maxb);
	}

	weights.resize(inst.nsizes);
	for (int i = 0; i < inst.nsizes; i++) {
		weights[i] = sitems[i].w;
	}
	weights.push_back(std::vector<int>(inst.ndims, 0));  // loss arcs

	max_rep = count_max_rep(maxW, 0, 0);

	for (int i = 0; i < static_cast<int>(max_state.size()); i++) {
		int nbits = 0, value = max_state[i];
		while (value) {
			nbits++;
			value >>= 1;
		}
		hash_bits.push_back(nbits);
	}

	printf("Build (method = %d)\n", inst.method);
	throw_assert(inst.method >= MIN_METHOD && inst.method <= MAX_METHOD);

	build();  // build step-3' graph
	int nv1 = NS.size() + inst.nbtypes;
	int na1 = A.size() + (NS.size() - 1) * inst.nbtypes + 1;
	printf("  Step-3' Graph: %d vertices and %d arcs (%.2fs)\n",
		   nv1, na1, TIMEDIF(tstart));

	final_compression_step();  // create step-4' graph
	finalize();  // add the final loss arcs
	int nv2 = NS.size() + Ts.size();
	int na2 = A.size();
	printf("  Step-4' Graph: %d vertices and %d arcs (%.2fs)\n",
		   nv2, na2, TIMEDIF(tstart));
	printf("  #V4/#V3 = %.2f\n", nv2 / static_cast<double>(nv1));
	printf("  #A4/#A3 = %.2f\n", na2 / static_cast<double>(na1));
	printf("Ready! (%.2fs)\n", TIMEDIF(tstart));
	throw_assert(ready == true);
}